

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_DestroyObject(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_OBJECT_HANDLE hObject)

{
  byte bVar1;
  byte bVar2;
  Session *this_00;
  Token *pTVar3;
  long *plVar4;
  ulong uVar5;
  CK_STATE sessionState;
  Session *in_RDI;
  CK_OBJECT_HANDLE in_stack_00000008;
  CK_BBOOL isDestroyable;
  CK_RV rv;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  OSObject *object;
  Token *token;
  Session *session;
  Session *hObject_00;
  HandleManager *in_stack_fffffffffffffff8;
  CK_RV CVar6;
  
  if (((ulong)in_RDI->slot & 1) == 0) {
    CVar6 = 400;
  }
  else {
    hObject_00 = in_RDI;
    this_00 = (Session *)
              HandleManager::getSession(in_stack_fffffffffffffff8,(CK_SESSION_HANDLE)in_RDI);
    if (this_00 == (Session *)0x0) {
      CVar6 = 0xb3;
    }
    else {
      pTVar3 = Session::getToken(this_00);
      if (pTVar3 == (Token *)0x0) {
        CVar6 = 5;
      }
      else {
        plVar4 = (long *)HandleManager::getObject
                                   (in_stack_fffffffffffffff8,(CK_OBJECT_HANDLE)hObject_00);
        if ((plVar4 == (long *)0x0) || (uVar5 = (**(code **)(*plVar4 + 0x50))(), (uVar5 & 1) == 0))
        {
          CVar6 = 0x82;
        }
        else {
          bVar1 = (**(code **)(*plVar4 + 0x20))(plVar4,1,0);
          bVar2 = (**(code **)(*plVar4 + 0x20))(plVar4,2,1);
          sessionState = Session::getState(in_RDI);
          CVar6 = haveWrite(sessionState,bVar1 & 1,bVar2 & 1);
          if (CVar6 == 0) {
            bVar1 = (**(code **)(*plVar4 + 0x20))(plVar4,0x172,1);
            if ((bVar1 & 1) == 0) {
              CVar6 = 0x1b;
            }
            else {
              HandleManager::destroyObject((HandleManager *)rv,in_stack_00000008);
              uVar5 = (**(code **)(*plVar4 + 0x70))();
              if ((uVar5 & 1) == 0) {
                CVar6 = 6;
              }
              else {
                CVar6 = 0;
              }
            }
          }
          else {
            if (CVar6 == 0x101) {
              softHSMLog(6,"C_DestroyObject",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0x700,"User is not authorized");
            }
            if (CVar6 == 0xb5) {
              softHSMLog(6,"C_DestroyObject",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0x702,"Session is read-only");
            }
          }
        }
      }
    }
  }
  return CVar6;
}

Assistant:

CK_RV SoftHSM::C_DestroyObject(CK_SESSION_HANDLE hSession, CK_OBJECT_HANDLE hObject)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Check the object handle.
	OSObject *object = (OSObject *)handleManager->getObject(hObject);
	if (object == NULL_PTR || !object->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = object->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = object->getBooleanValue(CKA_PRIVATE, true);

	// Check user credentials
	CK_RV rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Check if the object is destroyable
	CK_BBOOL isDestroyable = object->getBooleanValue(CKA_DESTROYABLE, true);
	if (!isDestroyable) return CKR_ACTION_PROHIBITED;

	// Tell the handleManager to forget about the object.
	handleManager->destroyObject(hObject);

	// Destroy the object
	if (!object->destroyObject())
		return CKR_FUNCTION_FAILED;

	return CKR_OK;
}